

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

NodeSequence __thiscall
GraphBuilder::insertFunction(GraphBuilder *this,Function *function,CallInst *callInstruction)

{
  bool bVar1;
  Function *pFVar2;
  Function *in_RDX;
  GraphBuilder *in_RSI;
  CallInst *in_RDI;
  GraphBuilder *unaff_retaddr;
  NodeSequence nodeSeq;
  Node *callNode;
  CallInst *args;
  undefined1 in_stack_ffffffffffffffc0 [16];
  Node *local_30;
  NodeSequence in_stack_fffffffffffffff0;
  
  bVar1 = llvm::Function::empty((Function *)0x195036);
  args = in_stack_ffffffffffffffc0._0_8_;
  if (bVar1) {
    in_stack_fffffffffffffff0 =
         insertUndefinedFunction
                   (unaff_retaddr,(Function *)in_stack_fffffffffffffff0.second,
                    (CallInst *)in_stack_fffffffffffffff0.first);
  }
  else {
    pFVar2 = llvm::CallBase::getCalledFunction((CallBase *)in_stack_ffffffffffffffc0._8_8_);
    if (pFVar2 == (Function *)0x0) {
      local_30 = &createNode<(NodeType)7,decltype(nullptr),llvm::CallInst_const*>(args,in_RDI)->
                  super_Node;
    }
    else {
      local_30 = &createNode<(NodeType)7,llvm::CallInst_const*>(args)->super_Node;
    }
    addNode<Node>((GraphBuilder *)callNode,nodeSeq.second);
    createOrGetFunction(in_RSI,in_RDX);
    Node::addSuccessor(in_stack_fffffffffffffff0.second,in_stack_fffffffffffffff0.first);
    std::pair<Node_*,_Node_*>::pair<Node_*&,_Node_*&,_true>
              ((pair<Node_*,_Node_*> *)&stack0xfffffffffffffff0,&local_30,
               (Node **)&stack0xffffffffffffffc8);
  }
  return in_stack_fffffffffffffff0;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertFunction(const Function *function,
                             const CallInst *callInstruction) {
    if (function->empty()) {
        return insertUndefinedFunction(function, callInstruction);
    }
    Node *callNode;
    if (callInstruction->getCalledFunction()) {
        callNode = createNode<NodeType::CALL>(callInstruction);
    } else {
        callNode = createNode<NodeType::CALL>(nullptr, callInstruction);
    }
    addNode(callNode);
    auto nodeSeq = createOrGetFunction(function);
    callNode->addSuccessor(nodeSeq.first);
    return {callNode, nodeSeq.second};
}